

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.cpp
# Opt level: O3

void __thiscall OpenMD::Bend::calcForce(Bend *this,RealType *angle,bool doParticlePot)

{
  RealType *pRVar1;
  double *pdVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  DataStoragePointer DVar9;
  Snapshot *pSVar10;
  double dVar11;
  uint i;
  long lVar12;
  long lVar13;
  long lVar14;
  uint i_17;
  long lVar15;
  uint i_18;
  long lVar16;
  double tmp;
  double dVar17;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_12;
  RealType dVdTheta;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result_6;
  double local_1b8 [4];
  Vector3d local_198;
  double local_180;
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8;
  double local_f0 [5];
  double local_c8 [4];
  Vector3d local_a8;
  double local_88 [4];
  double local_68 [4];
  double local_48 [4];
  
  ppAVar3 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar4 = *ppAVar3;
  lVar13 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar12 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar4->super_StuntDouble).storage_);
  local_48[2] = (double)*(undefined8 *)(lVar12 + 0x10 + lVar13 * 0x18);
  pdVar2 = (double *)(lVar12 + lVar13 * 0x18);
  local_48[0] = *pdVar2;
  local_48[1] = pdVar2[1];
  pAVar4 = ppAVar3[1];
  lVar13 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar12 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar4->super_StuntDouble).storage_);
  local_88[2] = (double)*(undefined8 *)(lVar12 + 0x10 + lVar13 * 0x18);
  pdVar2 = (double *)(lVar12 + lVar13 * 0x18);
  local_88[0] = *pdVar2;
  local_88[1] = pdVar2[1];
  pAVar4 = ppAVar3[2];
  lVar13 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar12 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar4->super_StuntDouble).storage_);
  local_68[2] = (double)*(undefined8 *)(lVar12 + 0x10 + lVar13 * 0x18);
  pdVar2 = (double *)(lVar12 + lVar13 * 0x18);
  local_68[0] = *pdVar2;
  local_68[1] = pdVar2[1];
  local_198.super_Vector<double,_3U>.data_[0] = 0.0;
  local_198.super_Vector<double,_3U>.data_[1] = 0.0;
  local_198.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar12 = 0;
  do {
    local_198.super_Vector<double,_3U>.data_[lVar12] = local_48[lVar12] - local_88[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_a8.super_Vector<double,_3U>.data_[2] = local_198.super_Vector<double,_3U>.data_[2];
  local_a8.super_Vector<double,_3U>.data_[0] = local_198.super_Vector<double,_3U>.data_[0];
  local_a8.super_Vector<double,_3U>.data_[1] = local_198.super_Vector<double,_3U>.data_[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_a8);
  dVar11 = 0.0;
  lVar12 = 0;
  do {
    dVar17 = local_a8.super_Vector<double,_3U>.data_[lVar12];
    dVar11 = dVar11 + dVar17 * dVar17;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  lVar12 = 0;
  do {
    local_1b8[lVar12] = local_68[lVar12] - local_88[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_198.super_Vector<double,_3U>.data_[2] = local_1b8[2];
  local_198.super_Vector<double,_3U>.data_[0] = local_1b8[0];
  local_198.super_Vector<double,_3U>.data_[1] = local_1b8[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_198);
  local_118[3] = 0.0;
  lVar12 = 0;
  do {
    dVar17 = local_198.super_Vector<double,_3U>.data_[lVar12];
    local_118[3] = local_118[3] + dVar17 * dVar17;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  if (local_118[3] < 0.0) {
    local_118[3] = sqrt(local_118[3]);
  }
  else {
    local_118[3] = SQRT(local_118[3]);
  }
  dVar17 = 0.0;
  lVar12 = 0;
  do {
    dVar17 = dVar17 + local_a8.super_Vector<double,_3U>.data_[lVar12] *
                      local_198.super_Vector<double,_3U>.data_[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  dVar17 = dVar17 / (dVar11 * local_118[3]);
  local_180 = 1.0;
  if ((dVar17 <= 1.0) && (local_180 = dVar17, dVar17 < -1.0)) {
    local_180 = -1.0;
  }
  local_f8 = 1.0 / dVar11;
  dVar11 = acos(local_180);
  pRVar1 = &this->potential_;
  (*this->bendType_->_vptr_BendType[2])(this->bendType_,pRVar1,local_f0);
  dVar17 = 1.0 - local_180 * local_180;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  local_118[3] = 1.0 / local_118[3];
  local_f0[0] = local_f0[0] /
                (double)(~-(ulong)(ABS(dVar17) < 1e-06) & (ulong)dVar17 |
                        -(ulong)(ABS(dVar17) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar12 = 0;
  do {
    local_138[lVar12] = local_198.super_Vector<double,_3U>.data_[lVar12] * local_118[3];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_178[2] = 0.0;
  lVar12 = 0;
  do {
    local_178[lVar12] = local_a8.super_Vector<double,_3U>.data_[lVar12] * local_f8;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  lVar12 = 0;
  do {
    local_158[lVar12] = local_178[lVar12] * local_180;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  lVar12 = 0;
  do {
    local_1b8[lVar12] = local_138[lVar12] - local_158[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar12 = 0;
  do {
    local_c8[lVar12] = local_1b8[lVar12] * local_f8 * local_f0[0];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar12 = 0;
  do {
    local_138[lVar12] = local_a8.super_Vector<double,_3U>.data_[lVar12] * local_f8;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_178[2] = 0.0;
  lVar12 = 0;
  do {
    local_178[lVar12] = local_198.super_Vector<double,_3U>.data_[lVar12] * local_118[3];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  lVar12 = 0;
  do {
    local_158[lVar12] = local_178[lVar12] * local_180;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  lVar12 = 0;
  do {
    local_1b8[lVar12] = local_138[lVar12] - local_158[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_f0[1] = 0.0;
  local_f0[2] = 0.0;
  local_f0[3] = 0.0;
  lVar12 = 0;
  do {
    local_f0[lVar12 + 1] = local_1b8[lVar12] * local_118[3] * local_f0[0];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  lVar12 = 0;
  do {
    local_118[lVar12] = local_c8[lVar12] + local_f0[lVar12 + 1];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    local_118[lVar12] = -local_118[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  ppAVar3 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar4 = *ppAVar3;
  DVar5 = (pAVar4->super_StuntDouble).storage_;
  pSVar6 = ((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar12 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar13 = lVar12 * 0x18 +
           *(long *)((long)&(pSVar6->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar5);
  lVar14 = 0;
  do {
    *(double *)(lVar13 + lVar14 * 8) = local_c8[lVar14] + *(double *)(lVar13 + lVar14 * 8);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  pAVar4 = ppAVar3[1];
  DVar7 = (pAVar4->super_StuntDouble).storage_;
  pSVar8 = ((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar13 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar14 = lVar13 * 0x18 +
           *(long *)((long)&(pSVar8->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar7);
  lVar15 = 0;
  do {
    *(double *)(lVar14 + lVar15 * 8) = local_118[lVar15] + *(double *)(lVar14 + lVar15 * 8);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  pAVar4 = ppAVar3[2];
  DVar9 = (pAVar4->super_StuntDouble).storage_;
  pSVar10 = ((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar14 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar16 = lVar14 * 0x18 +
           *(long *)((long)&(pSVar10->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar9);
  lVar15 = 0;
  do {
    *(double *)(lVar16 + lVar15 * 8) = local_f0[lVar15 + 1] + *(double *)(lVar16 + lVar15 * 8);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  if (doParticlePot) {
    lVar15 = *(long *)((long)&(pSVar6->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar5);
    *(double *)(lVar15 + lVar12 * 8) = *pRVar1 + *(double *)(lVar15 + lVar12 * 8);
    lVar12 = *(long *)((long)&(pSVar8->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar7);
    *(double *)(lVar12 + lVar13 * 8) = *pRVar1 + *(double *)(lVar12 + lVar13 * 8);
    lVar12 = *(long *)((long)&(pSVar10->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar9);
    *(double *)(lVar12 + lVar14 * 8) = *pRVar1 + *(double *)(lVar12 + lVar14 * 8);
  }
  *angle = (dVar11 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void Bend::calcForce(RealType& angle, bool doParticlePot) {
    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = atoms_[2]->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    RealType d21 = r21.length();

    RealType d21inv = 1.0 / d21;

    Vector3d r23 = pos3 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r23);
    RealType d23 = r23.length();

    RealType d23inv = 1.0 / d23;

    RealType cosTheta = dot(r21, r23) / (d21 * d23);

    // check roundoff
    if (cosTheta > 1.0) {
      cosTheta = 1.0;
    } else if (cosTheta < -1.0) {
      cosTheta = -1.0;
    }

    RealType theta = acos(cosTheta);

    RealType dVdTheta;

    bendType_->calcForce(theta, potential_, dVdTheta);

    RealType sinTheta = sqrt(1.0 - cosTheta * cosTheta);

    if (fabs(sinTheta) < 1.0E-6) { sinTheta = 1.0E-6; }

    RealType commonFactor1 = dVdTheta / sinTheta * d21inv;
    RealType commonFactor2 = dVdTheta / sinTheta * d23inv;

    Vector3d force1 = commonFactor1 * (r23 * d23inv - r21 * d21inv * cosTheta);
    Vector3d force3 = commonFactor2 * (r21 * d21inv - r23 * d23inv * cosTheta);

    // Total force in current bend is zero
    Vector3d force2 = force1 + force3;
    force2 *= -1.0;

    atoms_[0]->addFrc(force1);
    atoms_[1]->addFrc(force2);
    atoms_[2]->addFrc(force3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
    }

    angle = theta / Constants::PI * 180.0;
  }